

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86CALL(uchar *stream,x86Size param_2,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uint uVar1;
  uchar *puVar2;
  uchar *start;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size param_1_local;
  uchar *stream_local;
  
  uVar1 = encodeRex(stream,false,rNONE,index,base);
  puVar2 = stream + uVar1;
  *puVar2 = 0xff;
  uVar1 = encodeAddress(puVar2 + 1,index,multiplier,base,shift,2);
  return ((int)(puVar2 + 1) + uVar1) - (int)stream;
}

Assistant:

int x86CALL(unsigned char *stream, x86Size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, rNONE, index, base);
	*stream++ = 0xff;
	stream += encodeAddress(stream, index, multiplier, base, shift, 2);

	return int(stream - start);
}